

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O1

tokens __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::ScanStringTemplateMiddleOrEnd
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,EncodedCharPtr *pp)

{
  EncodedCharPtr puVar1;
  EncodedCharPtr puVar2;
  utf8char_t uVar3;
  
  Scanner<UTF8EncodingPolicyBase<false>>::ScanStringConstant<true,true>
            ((Scanner<UTF8EncodingPolicyBase<false>> *)this,L'`',pp);
  puVar1 = this->m_pchLast;
  puVar2 = *pp;
  *pp = puVar2 + 1;
  if (puVar2 < puVar1) {
    uVar3 = *puVar2;
  }
  else {
    uVar3 = '\0';
  }
  if (uVar3 == '$') {
    puVar2 = *pp;
    *pp = puVar2 + 1;
    if ((puVar2 < puVar1) && (*puVar2 == '{')) {
      return tkStrTmplMid;
    }
  }
  else if (uVar3 == '`') {
    this->m_fStringTemplateDepth = this->m_fStringTemplateDepth - 1;
    return tkStrTmplEnd;
  }
  *pp = *pp + -1;
  this->m_ptoken->tk = tkLastKwd;
  return tkLastKwd;
}

Assistant:

tokens Scanner<EncodingPolicy>::ScanStringTemplateMiddleOrEnd(EncodedCharPtr *pp)
{
    // String template middle and end tokens must begin with a string constant
    ScanStringConstant<true, true>('`', pp);

    OLECHAR ch;
    EncodedCharPtr last = m_pchLast;

    ch = this->ReadFirst(*pp, last);

    if (ch == '`')
    {
        // No longer in string template scanning mode
        m_fStringTemplateDepth--;

        // This is the last part of the template ...`
        return tkStrTmplEnd;
    }
    else if (ch == '$')
    {
        ch = this->ReadFirst(*pp, last);

        if (ch == '{')
        {
            // This is just another middle part of the template }...${
            return tkStrTmplMid;
        }
    }

    // Error - make sure pointer stays at the last character of the error token instead of after it in the error case
    (*pp)--;
    return ScanError(m_currentCharacter, tkStrTmplEnd);
}